

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O1

bool rcg::setEnum(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,char *value,bool exception
                 )

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  long *plVar4;
  undefined8 uVar5;
  invalid_argument *piVar6;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  peVar1 = (nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  GenICam_3_4::gcstring::gcstring((gcstring *)&local_c0,name);
  iVar2 = (*(peVar1->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar1,&local_c0);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring((gcstring *)&local_c0);
  if (plVar3 == (long *)0x0) {
    if (exception) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_e0 = &local_d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Feature not found: ","");
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_e0);
      local_c0 = (long *)*plVar3;
      plVar4 = plVar3 + 2;
      if (local_c0 == plVar4) {
        local_b0 = *plVar4;
        lStack_a8 = plVar3[3];
        local_c0 = &local_b0;
      }
      else {
        local_b0 = *plVar4;
      }
      local_b8 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar6,(string *)&local_c0);
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    iVar2 = (*(code *)**(undefined8 **)((long)plVar3 + *(long *)(*plVar3 + -0x28)))
                      ((long)plVar3 + *(long *)(*plVar3 + -0x28));
    if ((iVar2 == 4) || (iVar2 == 2)) {
      plVar3 = (long *)__dynamic_cast(plVar3,&GenApi_3_4::INode::typeinfo,
                                      &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
      if (plVar3 == (long *)0x0) {
        if (exception) {
          piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
          local_e0 = &local_d0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,"Feature not enumeration: ","");
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_e0);
          local_c0 = (long *)*plVar3;
          plVar4 = plVar3 + 2;
          if (local_c0 == plVar4) {
            local_b0 = *plVar4;
            lStack_a8 = plVar3[3];
            local_c0 = &local_b0;
          }
          else {
            local_b0 = *plVar4;
          }
          local_b8 = plVar3[1];
          *plVar3 = (long)plVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          std::invalid_argument::invalid_argument(piVar6,(string *)&local_c0);
          __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        GenICam_3_4::gcstring::gcstring((gcstring *)&local_c0,value);
        plVar4 = (long *)(**(code **)(*plVar3 + 0x68))(plVar3,&local_c0);
        GenICam_3_4::gcstring::~gcstring((gcstring *)&local_c0);
        if (plVar4 == (long *)0x0) {
          if (exception) {
            piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
            local_70[0] = local_60;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Enumeration \'","");
            plVar3 = (long *)std::__cxx11::string::append((char *)local_70);
            local_50 = (long *)*plVar3;
            plVar4 = plVar3 + 2;
            if (local_50 == plVar4) {
              local_40 = *plVar4;
              lStack_38 = plVar3[3];
              local_50 = &local_40;
            }
            else {
              local_40 = *plVar4;
            }
            local_48 = plVar3[1];
            *plVar3 = (long)plVar4;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_e0 = (long *)*plVar3;
            plVar4 = plVar3 + 2;
            if (local_e0 == plVar4) {
              local_d0 = *plVar4;
              lStack_c8 = plVar3[3];
              local_e0 = &local_d0;
            }
            else {
              local_d0 = *plVar4;
            }
            local_d8 = plVar3[1];
            *plVar3 = (long)plVar4;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_e0);
            local_c0 = (long *)*plVar3;
            plVar4 = plVar3 + 2;
            if (local_c0 == plVar4) {
              local_b0 = *plVar4;
              lStack_a8 = plVar3[3];
              local_c0 = &local_b0;
            }
            else {
              local_b0 = *plVar4;
            }
            local_b8 = plVar3[1];
            *plVar3 = (long)plVar4;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            std::invalid_argument::invalid_argument(piVar6,(string *)&local_c0);
            __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
        }
        else {
          uVar5 = (**(code **)(*plVar4 + 0x38))(plVar4);
          (**(code **)(*plVar3 + 0x50))(plVar3,uVar5,1);
        }
        if (plVar4 != (long *)0x0) {
          return true;
        }
      }
    }
    else if (exception) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_e0 = &local_d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"Feature not writable: ","");
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_e0);
      local_c0 = (long *)*plVar3;
      plVar4 = plVar3 + 2;
      if (local_c0 == plVar4) {
        local_b0 = *plVar4;
        lStack_a8 = plVar3[3];
        local_c0 = &local_b0;
      }
      else {
        local_b0 = *plVar4;
      }
      local_b8 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar6,(string *)&local_c0);
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return false;
}

Assistant:

bool setEnum(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
             const char *value, bool exception)
{
  bool ret=false;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsWritable(node))
      {
        GenApi::IEnumeration *val=dynamic_cast<GenApi::IEnumeration *>(node);

        if (val != 0)
        {
          GenApi::IEnumEntry *entry=0;

          try
          {
            entry=val->GetEntryByName(value);
          }
          catch (const GENICAM_NAMESPACE::GenericException &)
          { }

          if (entry != 0)
          {
            val->SetIntValue(entry->GetValue());

            return true;
          }
          else if (exception)
          {
            throw std::invalid_argument(std::string("Enumeration '")+name+
                                        "' does not contain: "+value);
          }
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not enumeration: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not writable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}